

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O0

int cfg_cmd_handle_schema(cfg_db *db,char *arg,autobuf *log)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *local_d8;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  char *last_type;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  char *pcStack_40;
  int result;
  char *ptr;
  char *copy;
  cfg_schema_section *s_section;
  autobuf *log_local;
  char *arg_local;
  cfg_db *db_local;
  
  if (db->schema == (cfg_schema *)0x0) {
    abuf_puts(log,"Internal error, database not connected to schema\n");
    db_local._4_4_ = -1;
  }
  else if ((arg == (char *)0x0) || (*arg == '\0')) {
    abuf_puts(log,
              "List of section types:\n(use this command with the types as parameter for more information)\n"
             );
    for (copy = (char *)(db->schema->sections).list_head.next;
        *(list_entity **)(copy + 8) != (db->schema->sections).list_head.prev; copy = *(char **)copy)
    {
      if ((copy[0x31] & 1U) == 0) {
        pcVar2 = "";
        if (*(long *)(copy + 0x50) != 0) {
          pcVar2 = ": ";
        }
        if (*(long *)(copy + 0x50) == 0) {
          local_d8 = "";
        }
        else {
          local_d8 = *(char **)(copy + 0x50);
        }
        cfg_append_printable_line
                  (log,"    %s (%s)%s%s",*(undefined8 *)(copy + 0x38),
                   CFG_SCHEMA_SECTIONMODE[*(uint *)(copy + 0x48)],pcVar2,local_d8);
      }
      else if (*(long *)(copy + 0x50) != 0) {
        cfg_append_printable_line(log,"        %s",*(undefined8 *)(copy + 0x50));
      }
    }
    db_local._4_4_ = 0;
  }
  else {
    iVar1 = strcmp(arg,"all");
    if (iVar1 == 0) {
      __tempptr_3 = (list_entity *)0x0;
      for (copy = (char *)(db->schema->sections).list_head.next;
          *(list_entity **)(copy + 8) != (db->schema->sections).list_head.prev;
          copy = *(char **)copy) {
        if ((__tempptr_3 == (list_entity *)0x0) ||
           (iVar1 = strcasecmp(*(char **)(copy + 0x38),(char *)__tempptr_3), iVar1 != 0)) {
          if (__tempptr_3 != (list_entity *)0x0) {
            abuf_puts(log,"\n");
          }
          _print_schema_section(log,db,*(char **)(copy + 0x38));
          __tempptr_3 = *(list_entity **)(copy + 0x38);
        }
      }
      db_local._4_4_ = 0;
    }
    else {
      pcVar2 = strdup(arg);
      pcVar3 = strchr(pcVar2,0x2e);
      pcStack_40 = pcVar3;
      if (pcVar3 != (char *)0x0) {
        pcStack_40 = pcVar3 + 1;
        *pcVar3 = '\0';
      }
      if (pcStack_40 == (char *)0x0) {
        __tempptr._4_4_ = _print_schema_section(log,db,pcVar2);
      }
      else {
        __tempptr._4_4_ = _print_schema_entry(log,db,pcVar2,pcStack_40);
      }
      free(pcVar2);
      db_local._4_4_ = __tempptr._4_4_;
    }
  }
  return db_local._4_4_;
}

Assistant:

int
cfg_cmd_handle_schema(struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct cfg_schema_section *s_section;
  char *copy, *ptr;
  int result;

  if (db->schema == NULL) {
    abuf_puts(log, "Internal error, database not connected to schema\n");
    return -1;
  }

  if (arg == NULL || *arg == 0) {
    abuf_puts(log, "List of section types:\n"
                   "(use this command with the types as parameter for more information)\n");
    avl_for_each_element(&db->schema->sections, s_section, _section_node) {
      if (!s_section->_section_node.follower) {
        cfg_append_printable_line(log, CFG_HELP_INDENT_PREFIX "%s (%s)%s%s", s_section->type,
          CFG_SCHEMA_SECTIONMODE[s_section->mode], s_section->help ? ": " : "", s_section->help ? s_section->help : "");
      }
      else if (s_section->help) {
        cfg_append_printable_line(log, CFG_HELP_INDENT_PREFIX CFG_HELP_INDENT_PREFIX "%s", s_section->help);
      }
    }
    return 0;
  }

  if (strcmp(arg, "all") == 0) {
    const char *last_type = NULL;

    avl_for_each_element(&db->schema->sections, s_section, _section_node) {
      if (last_type == NULL || strcasecmp(s_section->type, last_type) != 0) {
        if (last_type != NULL) {
          abuf_puts(log, "\n");
        }
        _print_schema_section(log, db, s_section->type);
        last_type = s_section->type;
      }
    }
    return 0;
  }

  /* copy string into stack*/
  copy = strdup(arg);

  /* prepare for cleanup */
  result = -1;

  ptr = strchr(copy, '.');
  if (ptr) {
    *ptr++ = 0;
  }

  if (ptr == NULL) {
    result = _print_schema_section(log, db, copy);
  }
  else {
    result = _print_schema_entry(log, db, copy, ptr);
  }

  free(copy);
  return result;
}